

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadList.h
# Opt level: O0

void __thiscall
QuadList<SSTableDataEntry>::QuadList(QuadList<SSTableDataEntry> *this,QuadList<SSTableDataEntry> *q)

{
  QuadList<SSTableDataEntry> *q_local;
  QuadList<SSTableDataEntry> *this_local;
  
  this->_vptr_QuadList = (_func_int **)&PTR__QuadList_0012acd0;
  this->_size = 0;
  this->header = q->header;
  this->trailer = q->trailer;
  this->_size = q->_size;
  q->header = (NodePosi)0x0;
  q->trailer = (NodePosi)0x0;
  return;
}

Assistant:

QuadList<T>::QuadList(QuadList &&q) noexcept {
    this->header = q.header;
    this->trailer = q.trailer;
    this->_size = q._size;
    q.header = nullptr;
    q.trailer = nullptr;
}